

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  bool bVar1;
  int iVar2;
  int y_;
  uint uVar3;
  float *pfVar4;
  float width;
  float height;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float z_;
  float local_2a4;
  float local_274;
  Vec4 local_268;
  undefined1 local_255;
  bool isOk;
  Vec2 local_24c;
  Vec2 local_244;
  Vec2 clampedLod;
  Vec2 lodO;
  Vec3 coordDyo;
  Vec3 coordDxo;
  Vec3 coordO;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vec2 lodBounds;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  undefined1 local_198 [12];
  undefined1 local_18c [12];
  Vector<float,_3> local_180;
  Vector<float,_3> local_174;
  Vector<bool,_3> local_167;
  undefined1 local_164 [8];
  Vec4 refPix;
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_128;
  Vec2 lodOffsets [4];
  int numFailed;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_d8 [8];
  Vec3 triR [2];
  undefined1 local_b8 [8];
  Vec3 triT [2];
  undefined1 local_98 [8];
  Vec3 triS [2];
  int srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  TextureCubeView *src_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(result);
  y_ = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar2,y_);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  width = (float)iVar2;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  height = (float)iVar2;
  triS[1].m_data[2] = (float)tcu::TextureCubeView::getSize(src);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_98,(int)&tq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&tq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_b8,(int)&rq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)&rq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_d8,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_274 = 0.0;
  }
  else {
    local_274 = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffff00,local_274);
  lodOffsets[3].m_data[1] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_128,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  for (resPix.m_data[3] = 0.0; iVar2 = tcu::ConstPixelBufferAccess::getHeight(result),
      (int)resPix.m_data[3] < iVar2; resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1)) {
    for (resPix.m_data[2] = 0.0; iVar2 = tcu::ConstPixelBufferAccess::getWidth(result),
        (int)resPix.m_data[2] < iVar2; resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_164,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_18c,(int)local_164,1,2);
      tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_198,(int)&refPix + 8,1,2);
      tcu::operator-((tcu *)&local_180,(Vector<float,_3> *)local_18c,(Vector<float,_3> *)local_198);
      tcu::abs<float,3>((tcu *)&local_174,&local_180);
      tcu::lessThanEqual<float,3>((tcu *)&local_167,&local_174,nonShadowThreshold);
      bVar1 = tcu::boolAll<3>(&local_167);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        fVar5 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(refPix.m_data + 2));
        fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_164);
        if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
          fVar7 = (float)(int)resPix.m_data[2] + 0.5;
          fVar8 = (float)(int)resPix.m_data[3] + 0.5;
          fVar9 = fVar7 / width;
          local_2a4 = fVar8 / height;
          uVar3 = (uint)(1.0 <= fVar9 + local_2a4);
          fVar5 = fVar8;
          fVar6 = fVar7;
          if (uVar3 != 0) {
            fVar9 = 1.0 - fVar9;
            local_2a4 = 1.0 - local_2a4;
            fVar5 = height - fVar8;
            fVar6 = width - fVar7;
          }
          fVar10 = projectedTriInterpolate
                             ((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar9,local_2a4);
          fVar11 = projectedTriInterpolate
                             ((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar9,local_2a4);
          fVar12 = projectedTriInterpolate
                             ((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar9,local_2a4);
          tcu::Vector<float,_3>::Vector
                    ((Vector<float,_3> *)(coordDx.m_data + 1),fVar10,fVar11,fVar12);
          fVar10 = triDerivateX((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar7,width,
                                local_2a4);
          fVar11 = triDerivateX((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar7,width,
                                local_2a4);
          fVar7 = triDerivateX((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar7,width,
                               local_2a4);
          tcu::Vector<float,_3>::Vector
                    ((Vector<float,_3> *)(coordDy.m_data + 1),fVar10,fVar11,fVar7);
          fVar7 = triDerivateY((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar8,height,fVar9)
          ;
          fVar10 = triDerivateY((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar8,height,fVar9
                               );
          fVar9 = triDerivateY((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar8,height,fVar9)
          ;
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&lodBounds,fVar7,fVar10,fVar9);
          tcu::computeCubeLodBoundsFromDerivates
                    ((tcu *)&wxo,(Vec3 *)(coordDx.m_data + 1),(Vec3 *)(coordDy.m_data + 1),
                     (Vec3 *)&lodBounds,(int)triS[1].m_data[2],lodPrec);
          for (wyo = 0.0; (int)wyo < 4; wyo = (float)((int)wyo + 1)) {
            fVar9 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
            fVar9 = fVar6 + fVar9;
            fVar7 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
            fVar7 = fVar5 + fVar7;
            fVar8 = fVar9 / width;
            fVar10 = fVar7 / height;
            fVar11 = projectedTriInterpolate
                               ((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar8,fVar10);
            fVar12 = projectedTriInterpolate
                               ((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar8,fVar10);
            z_ = projectedTriInterpolate
                           ((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                            (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar8,fVar10);
            tcu::Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(coordDxo.m_data + 1),fVar11,fVar12,z_);
            fVar11 = triDerivateX((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar9,width,
                                  fVar10);
            fVar12 = triDerivateX((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar9,width,
                                  fVar10);
            fVar9 = triDerivateX((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                                 (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar9,width,
                                 fVar10);
            tcu::Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(coordDyo.m_data + 1),fVar11,fVar12,fVar9);
            fVar9 = triDerivateY((Vec3 *)(triS[(long)(int)uVar3 + -1].m_data + 1),
                                 (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar7,height,
                                 fVar8);
            fVar10 = triDerivateY((Vec3 *)(triT[(long)(int)uVar3 + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar7,height,
                                  fVar8);
            fVar7 = triDerivateY((Vec3 *)(triR[(long)(int)uVar3 + -1].m_data + 1),
                                 (Vec3 *)((long)&lodBias + (long)(int)uVar3 * 0xc),fVar7,height,
                                 fVar8);
            tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&lodO,fVar9,fVar10,fVar7);
            tcu::computeCubeLodBoundsFromDerivates
                      ((tcu *)&clampedLod,(Vec3 *)(coordDxo.m_data + 1),
                       (Vec3 *)(coordDyo.m_data + 1),(Vec3 *)&lodO,(int)triS[1].m_data[2],lodPrec);
            pfVar4 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            fVar9 = *pfVar4;
            fVar7 = tcu::Vector<float,_2>::x(&clampedLod);
            fVar9 = de::min<float>(fVar9,fVar7);
            pfVar4 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            *pfVar4 = fVar9;
            pfVar4 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            fVar9 = *pfVar4;
            fVar7 = tcu::Vector<float,_2>::y(&clampedLod);
            fVar9 = de::max<float>(fVar9,fVar7);
            pfVar4 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            *pfVar4 = fVar9;
          }
          tcu::operator+((tcu *)&local_24c,(Vector<float,_2> *)&wxo,
                         (Vector<float,_2> *)&stack0xffffffffffffff00);
          tcu::Vector<float,_2>::Vector
                    ((Vector<float,_2> *)&stack0xfffffffffffffdac,sampleParams->minLod,
                     sampleParams->maxLod);
          tcu::clampLodBounds((tcu *)&local_244,&local_24c,(Vec2 *)&stack0xfffffffffffffdac,lodPrec)
          ;
          fVar5 = (sampleParams->super_RenderParams).ref;
          fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(refPix.m_data + 2));
          local_255 = tcu::isTexCompareResultValid
                                (src,&sampleParams->sampler,comparePrec,(Vec3 *)(coordDx.m_data + 1)
                                 ,&local_244,fVar5,fVar6);
          if (!(bool)local_255) {
            tcu::RGBA::red();
            tcu::RGBA::toVec((RGBA *)&local_268);
            tcu::PixelBufferAccess::setPixel
                      (errorMask,&local_268,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
            lodOffsets[3].m_data[1] = (float)((int)lodOffsets[3].m_data[1] + 1);
          }
        }
      }
      else {
        tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&wx);
        tcu::PixelBufferAccess::setPixel
                  (errorMask,(Vec4 *)&wx,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
        lodOffsets[3].m_data[1] = (float)((int)lodOffsets[3].m_data[1] + 1);
      }
    }
  }
  return (int)lodOffsets[3].m_data[1];
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::TextureCubeView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const int			srcSize			= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
				const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

				tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
					const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
					const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
					const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}